

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void * cgreen_vector_remove(CgreenVector *vector,int position)

{
  void *pvVar1;
  int iVar2;
  uint in_ESI;
  CgreenVector *in_RDI;
  int i;
  void *item;
  uint local_24;
  
  if (-1 < (int)in_ESI) {
    iVar2 = cgreen_vector_size(in_RDI);
    if ((int)in_ESI <= iVar2) {
      pvVar1 = in_RDI->items[(int)in_ESI];
      for (local_24 = in_ESI; (int)local_24 < in_RDI->size; local_24 = local_24 + 1) {
        in_RDI->items[(int)local_24] = in_RDI->items[(int)(local_24 + 1)];
      }
      in_RDI->items[in_RDI->size] = (void *)0x0;
      in_RDI->size = in_RDI->size + -1;
      return pvVar1;
    }
  }
  panic("src/vector.c",0x3c,"illegal position (%d) in vector operation",(ulong)in_ESI);
}

Assistant:

void *cgreen_vector_remove(CgreenVector *vector, int position) {
    void *item;
    int i;

    if (position < 0 || position > cgreen_vector_size(vector)) {
        PANIC("illegal position (%d) in vector operation", position);
        return NULL;
    }

    item = vector->items[position];

    for (i = position; i < vector->size; i++) {
        vector->items[i] = vector->items[i + 1];
    }

    vector->items[vector->size] = NULL;

    vector->size--;
    return item;
}